

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

void __thiscall compose::LeafNode::~LeafNode(LeafNode *this)

{
  (this->super_INode)._vptr_INode = (_func_int **)&PTR___cxa_pure_virtual_00136b10;
  std::__cxx11::string::~string((string *)&(this->super_INode).name_);
  return;
}

Assistant:

INode::~INode() {}